

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O2

void __thiscall duckdb::StringAggBindData::~StringAggBindData(StringAggBindData *this)

{
  *(undefined ***)this = &PTR__StringAggBindData_00931f48;
  std::__cxx11::string::~string((string *)&this->sep);
  duckdb::FunctionData::~FunctionData(&this->super_FunctionData);
  return;
}

Assistant:

explicit StringAggBindData(string sep_p) : sep(std::move(sep_p)) {
	}